

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForHelp::~CallForHelp(CallForHelp *this)

{
  void *in_RDI;
  
  ~CallForHelp((CallForHelp *)0x1b7f08);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

CallForHelp() : CallForHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}